

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDbvtBroadphase.cpp
# Opt level: O0

void __thiscall
btDbvtBroadphase::setAabb
          (btDbvtBroadphase *this,btBroadphaseProxy *absproxy,btVector3 *aabbMin,btVector3 *aabbMax,
          btDispatcher *param_5)

{
  bool bVar1;
  btScalar bVar2;
  btDbvtNode *pbVar3;
  btScalar *pbVar4;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  btDbvtProxy *in_RSI;
  btDbvtNode *in_RDI;
  ICollide *in_stack_00000028;
  btDbvtNode *in_stack_00000030;
  btDbvtTreeCollider collider;
  btVector3 velocity;
  btVector3 delta;
  bool docollide;
  btDbvtVolume aabb;
  btDbvtProxy *proxy;
  btDbvtBroadphase *in_stack_ffffffffffffff18;
  btVector3 *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  btDbvt *in_stack_ffffffffffffff40;
  btDbvtVolume *in_stack_ffffffffffffff48;
  ICollide in_stack_ffffffffffffff50;
  btDbvtBroadphase *in_stack_ffffffffffffff58;
  btVector3 local_74;
  btVector3 local_64;
  byte local_51;
  btDbvtProxy *local_30;
  undefined8 *local_20;
  undefined8 *local_18;
  
  local_30 = in_RSI;
  local_20 = in_RCX;
  local_18 = in_RDX;
  btDbvtAabbMm::FromMM
            ((btVector3 *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
             (btVector3 *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  local_51 = 0;
  if (local_30->stage == 2) {
    btDbvt::remove((btDbvt *)((long)&in_RDI[1].field_2 + 8),(char *)local_30->leaf);
    pbVar3 = btDbvt::insert((btDbvt *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                            (btDbvtVolume *)
                            CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                            in_stack_ffffffffffffff20);
    local_30->leaf = pbVar3;
    local_51 = 1;
  }
  else {
    *(int *)((long)&in_RDI[4].parent + 4) = *(int *)((long)&in_RDI[4].parent + 4) + 1;
    bVar1 = Intersect((btDbvtAabbMm *)in_stack_ffffffffffffff40,&in_RDI->volume);
    if (bVar1) {
      local_64 = operator-((btVector3 *)
                           CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                           (btVector3 *)
                           CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      operator-((btVector3 *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                (btVector3 *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      operator/(in_stack_ffffffffffffff20,(btScalar *)in_stack_ffffffffffffff18);
      local_74 = ::operator*((btVector3 *)
                             CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                             (btScalar *)
                             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      pbVar4 = btVector3::operator_cast_to_float_(&local_64);
      if (*pbVar4 <= 0.0 && *pbVar4 != 0.0) {
        pbVar4 = btVector3::operator_cast_to_float_(&local_74);
        bVar2 = -*pbVar4;
        pbVar4 = btVector3::operator_cast_to_float_(&local_74);
        *pbVar4 = bVar2;
      }
      pbVar4 = btVector3::operator_cast_to_float_(&local_64);
      if (pbVar4[1] <= 0.0 && pbVar4[1] != 0.0) {
        pbVar4 = btVector3::operator_cast_to_float_(&local_74);
        bVar2 = -pbVar4[1];
        pbVar4 = btVector3::operator_cast_to_float_(&local_74);
        pbVar4[1] = bVar2;
      }
      pbVar4 = btVector3::operator_cast_to_float_(&local_64);
      if (pbVar4[2] <= 0.0 && pbVar4[2] != 0.0) {
        pbVar4 = btVector3::operator_cast_to_float_(&local_74);
        bVar2 = -pbVar4[2];
        pbVar4 = btVector3::operator_cast_to_float_(&local_74);
        pbVar4[2] = bVar2;
      }
      bVar1 = btDbvt::update((btDbvt *)in_stack_ffffffffffffff58,
                             (btDbvtNode *)in_stack_ffffffffffffff50._vptr_ICollide,
                             in_stack_ffffffffffffff48,(btVector3 *)in_stack_ffffffffffffff40,
                             (btScalar)((ulong)in_RDI >> 0x20));
      if (bVar1) {
        in_RDI[4].field_2.dataAsInt = in_RDI[4].field_2.dataAsInt + 1;
        local_51 = 1;
      }
    }
    else {
      btDbvt::update(in_stack_ffffffffffffff40,in_RDI,
                     (btDbvtVolume *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
      in_RDI[4].field_2.dataAsInt = in_RDI[4].field_2.dataAsInt + 1;
      local_51 = 1;
    }
  }
  listremove<btDbvtProxy>
            (local_30,(btDbvtProxy **)((long)(&in_RDI[3].volume + 1) + (long)local_30->stage * 8));
  *(undefined8 *)(local_30->super_btBroadphaseProxy).m_aabbMin.m_floats = *local_18;
  *(undefined8 *)((local_30->super_btBroadphaseProxy).m_aabbMin.m_floats + 2) = local_18[1];
  *(undefined8 *)(local_30->super_btBroadphaseProxy).m_aabbMax.m_floats = *local_20;
  *(undefined8 *)((local_30->super_btBroadphaseProxy).m_aabbMax.m_floats + 2) = local_20[1];
  local_30->stage = (int)in_RDI[4].volume.mi.m_floats[3];
  listappend<btDbvtProxy>
            (local_30,(btDbvtProxy **)
                      ((long)(&in_RDI[3].volume + 1) +
                      (long)(int)in_RDI[4].volume.mi.m_floats[3] * 8));
  if (((local_51 & 1) != 0) &&
     (*(undefined1 *)((long)in_RDI[5].volume.mi.m_floats + 6) = 1,
     (*(byte *)((long)in_RDI[5].volume.mi.m_floats + 5) & 1) == 0)) {
    btDbvtTreeCollider::btDbvtTreeCollider
              ((btDbvtTreeCollider *)&stack0xffffffffffffff50,in_stack_ffffffffffffff18);
    btDbvt::collideTTpersistentStack
              ((btDbvt *)collider.pbp,(btDbvtNode *)collider.super_ICollide._vptr_ICollide,
               in_stack_00000030,in_stack_00000028);
    btDbvt::collideTTpersistentStack
              ((btDbvt *)collider.pbp,(btDbvtNode *)collider.super_ICollide._vptr_ICollide,
               in_stack_00000030,in_stack_00000028);
    btDbvtTreeCollider::~btDbvtTreeCollider((btDbvtTreeCollider *)0x161722);
  }
  return;
}

Assistant:

void							btDbvtBroadphase::setAabb(		btBroadphaseProxy* absproxy,
														  const btVector3& aabbMin,
														  const btVector3& aabbMax,
														  btDispatcher* /*dispatcher*/)
{
	btDbvtProxy*						proxy=(btDbvtProxy*)absproxy;
	ATTRIBUTE_ALIGNED16(btDbvtVolume)	aabb=btDbvtVolume::FromMM(aabbMin,aabbMax);
#if DBVT_BP_PREVENTFALSEUPDATE
	if(NotEqual(aabb,proxy->leaf->volume))
#endif
	{
		bool	docollide=false;
		if(proxy->stage==STAGECOUNT)
		{/* fixed -> dynamic set	*/ 
			m_sets[1].remove(proxy->leaf);
			proxy->leaf=m_sets[0].insert(aabb,proxy);
			docollide=true;
		}
		else
		{/* dynamic set				*/ 
			++m_updates_call;
			if(Intersect(proxy->leaf->volume,aabb))
			{/* Moving				*/ 

				const btVector3	delta=aabbMin-proxy->m_aabbMin;
				btVector3		velocity(((proxy->m_aabbMax-proxy->m_aabbMin)/2)*m_prediction);
				if(delta[0]<0) velocity[0]=-velocity[0];
				if(delta[1]<0) velocity[1]=-velocity[1];
				if(delta[2]<0) velocity[2]=-velocity[2];
				if	(
#ifdef DBVT_BP_MARGIN				
					m_sets[0].update(proxy->leaf,aabb,velocity,DBVT_BP_MARGIN)
#else
					m_sets[0].update(proxy->leaf,aabb,velocity)
#endif
					)
				{
					++m_updates_done;
					docollide=true;
				}
			}
			else
			{/* Teleporting			*/ 
				m_sets[0].update(proxy->leaf,aabb);
				++m_updates_done;
				docollide=true;
			}	
		}
		listremove(proxy,m_stageRoots[proxy->stage]);
		proxy->m_aabbMin = aabbMin;
		proxy->m_aabbMax = aabbMax;
		proxy->stage	=	m_stageCurrent;
		listappend(proxy,m_stageRoots[m_stageCurrent]);
		if(docollide)
		{
			m_needcleanup=true;
			if(!m_deferedcollide)
			{
				btDbvtTreeCollider	collider(this);
				m_sets[1].collideTTpersistentStack(m_sets[1].m_root,proxy->leaf,collider);
				m_sets[0].collideTTpersistentStack(m_sets[0].m_root,proxy->leaf,collider);
			}
		}	
	}
}